

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS
ref_geom_tri_uv_bounding_box(REF_GRID ref_grid,REF_INT node,REF_DBL *uv_min,REF_DBL *uv_max)

{
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  REF_INT cell;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  REF_INT id;
  ulong local_c8;
  REF_INT sense;
  REF_DBL uv [2];
  REF_INT nodes [27];
  
  ref_cell = ref_grid->cell[3];
  ref_geom = ref_grid->geom;
  uVar3 = ref_geom_unique_id(ref_geom,node,2,&id);
  if (uVar3 == 0) {
    uVar3 = ref_geom_tuv(ref_geom,node,2,id,uv_min);
    if (uVar3 == 0) {
      uVar3 = ref_geom_tuv(ref_geom,node,2,id,uv_max);
      if (uVar3 == 0) {
        uVar8 = 0xffffffff;
        cell = -1;
        if (-1 < node) {
          pRVar1 = ref_cell->ref_adj;
          uVar8 = 0xffffffff;
          cell = -1;
          if (node < pRVar1->nnode) {
            uVar3 = pRVar1->first[(uint)node];
            uVar8 = 0xffffffff;
            cell = -1;
            if ((long)(int)uVar3 != -1) {
              cell = pRVar1->item[(int)uVar3].ref;
              uVar8 = (ulong)uVar3;
            }
          }
        }
        while( true ) {
          if ((int)uVar8 == -1) {
            return 0;
          }
          uVar3 = ref_cell_nodes(ref_cell,cell,nodes);
          if (uVar3 != 0) break;
          local_c8 = uVar8;
          for (lVar7 = 0; lVar7 < ref_cell->node_per; lVar7 = lVar7 + 1) {
            uVar3 = ref_geom_cell_tuv(ref_geom,nodes[lVar7],nodes,2,uv,&sense);
            if (uVar3 != 0) {
              pcVar6 = "cell uv";
              uVar5 = 0x5d1;
              goto LAB_0014421e;
            }
            for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
              dVar9 = uv_min[lVar4];
              if (uv[lVar4] <= uv_min[lVar4]) {
                dVar9 = uv[lVar4];
              }
              uv_min[lVar4] = dVar9;
            }
            for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
              dVar9 = uv_max[lVar4];
              if (uv_max[lVar4] <= uv[lVar4]) {
                dVar9 = uv[lVar4];
              }
              uv_max[lVar4] = dVar9;
            }
          }
          pRVar2 = ref_cell->ref_adj->item;
          uVar8 = (ulong)pRVar2[(int)local_c8].next;
          cell = -1;
          if (uVar8 != 0xffffffffffffffff) {
            cell = pRVar2[uVar8].ref;
          }
        }
        pcVar6 = "cell nodes";
        uVar5 = 0x5cd;
LAB_0014421e:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               uVar5,"ref_geom_tri_uv_bounding_box",(ulong)uVar3,pcVar6);
        return uVar3;
      }
      pcVar6 = "uv_max";
      uVar5 = 0x5ca;
    }
    else {
      pcVar6 = "uv_min";
      uVar5 = 0x5c9;
    }
  }
  else {
    pcVar6 = "id";
    uVar5 = 0x5c8;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar5,
         "ref_geom_tri_uv_bounding_box",(ulong)uVar3,pcVar6);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tri_uv_bounding_box(REF_GRID ref_grid, REF_INT node,
                                                REF_DBL *uv_min,
                                                REF_DBL *uv_max) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, cell_node, id, iuv;
  REF_DBL uv[2];
  REF_INT sense;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  /* get face id and initialize min and max */
  RSS(ref_geom_unique_id(ref_geom, node, REF_GEOM_FACE, &id), "id");
  RSS(ref_geom_tuv(ref_geom, node, REF_GEOM_FACE, id, uv_min), "uv_min");
  RSS(ref_geom_tuv(ref_geom, node, REF_GEOM_FACE, id, uv_max), "uv_max");

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_geom_cell_tuv(ref_geom, nodes[cell_node], nodes, REF_GEOM_FACE,
                            uv, &sense),
          "cell uv");
      for (iuv = 0; iuv < 2; iuv++) uv_min[iuv] = MIN(uv_min[iuv], uv[iuv]);
      for (iuv = 0; iuv < 2; iuv++) uv_max[iuv] = MAX(uv_max[iuv], uv[iuv]);
    }
  }

  return REF_SUCCESS;
}